

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int getindex_aux(lua_State *L,lua_State *L1,char **pc)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  char **pc_local;
  lua_State *L1_local;
  lua_State *L_local;
  
  skip(pc);
  pcVar2 = *pc;
  *pc = pcVar2 + 1;
  cVar1 = *pcVar2;
  if (cVar1 == 'G') {
    L_local._4_4_ = luaL_error(L,"deprecated index \'G\'");
  }
  else if (cVar1 == 'R') {
    L_local._4_4_ = -0xf4628;
  }
  else if (cVar1 == 'U') {
    iVar3 = getnum_aux(L,L1,pc);
    L_local._4_4_ = -0xf4628 - iVar3;
  }
  else {
    *pc = *pc + -1;
    L_local._4_4_ = getnum_aux(L,L1,pc);
  }
  return L_local._4_4_;
}

Assistant:

static int getindex_aux (lua_State *L, lua_State *L1, const char **pc) {
  skip(pc);
  switch (*(*pc)++) {
    case 'R': return LUA_REGISTRYINDEX;
    case 'G': return luaL_error(L, "deprecated index 'G'");
    case 'U': return lua_upvalueindex(getnum_aux(L, L1, pc));
    default: (*pc)--; return getnum_aux(L, L1, pc);
  }
}